

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O2

void __thiscall
GuidedMeshNormalFiltering::updateFilteredNormalsLocalScheme
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  ParameterSet *pPVar1;
  pointer pVVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  vector_type *pvVar6;
  int j;
  PolyConnectivity *this_00;
  long lVar7;
  GuidedMeshNormalFiltering *this_01;
  _Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
  *this_02;
  pointer *this_03;
  long lVar8;
  long lVar9;
  pointer *centroid;
  long lVar10;
  double sigma;
  double dVar11;
  double dVar12;
  double dVar13;
  FaceIter FVar14;
  _Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
  local_190;
  undefined1 local_178 [8];
  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
  range_and_mean_normal;
  double multiple_radius;
  double multiple_sigma_s;
  double sigma_r;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  guided_normals;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  undefined1 local_110 [8];
  vector<double,_std::allocator<double>_> face_area;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  FaceIter f_it;
  int local_9c;
  int local_98;
  int face_neighbor_index;
  int normal_iteration_number;
  int vertex_iteration_number;
  PolyConnectivity *local_88;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *local_80;
  undefined1 local_78 [8];
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_guided_neighbor;
  undefined1 local_58 [8];
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  bool local_31 [8];
  bool include_central_face;
  
  local_88 = (PolyConnectivity *)mesh;
  iVar4 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))(mesh);
  local_80 = filtered_normals;
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (filtered_normals,(long)iVar4);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)local_58,"Face Neighbor",(allocator *)local_78);
  bVar3 = ParameterSet::getValue(pPVar1,(string *)local_58,&local_9c);
  std::__cxx11::string::~string((string *)local_58);
  if (bVar3) {
    pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
    std::__cxx11::string::string((string *)local_58,"include central face",(allocator *)local_78);
    bVar3 = ParameterSet::getValue(pPVar1,(string *)local_58,local_31);
    std::__cxx11::string::~string((string *)local_58);
    if (bVar3) {
      pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
      std::__cxx11::string::string
                ((string *)local_58,"Multiple(* avg face dis.)",(allocator *)local_78);
      bVar3 = ParameterSet::getValue
                        (pPVar1,(string *)local_58,
                         (double *)
                         &range_and_mean_normal.
                          super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_58);
      if (bVar3) {
        pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
        std::__cxx11::string::string((string *)local_58,"Multiple(* sigma_s)",(allocator *)local_78)
        ;
        bVar3 = ParameterSet::getValue(pPVar1,(string *)local_58,&multiple_radius);
        std::__cxx11::string::~string((string *)local_58);
        if (bVar3) {
          pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
          std::__cxx11::string::string
                    ((string *)local_58,"(Local)Normal Iteration Num.",(allocator *)local_78);
          bVar3 = ParameterSet::getValue(pPVar1,(string *)local_58,&local_98);
          std::__cxx11::string::~string((string *)local_58);
          if (bVar3) {
            pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
            std::__cxx11::string::string((string *)local_58,"sigma_r",(allocator *)local_78);
            bVar3 = ParameterSet::getValue(pPVar1,(string *)local_58,&multiple_sigma_s);
            std::__cxx11::string::~string((string *)local_58);
            if (bVar3) {
              pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
              std::__cxx11::string::string
                        ((string *)local_58,"Vertex Iteration Num.",(allocator *)local_78);
              bVar3 = ParameterSet::getValue(pPVar1,(string *)local_58,&face_neighbor_index);
              std::__cxx11::string::~string((string *)local_58);
              if (bVar3) {
                if (local_9c == 0) {
                  _normal_iteration_number =
                       getRadius(this,(double)range_and_mean_normal.
                                              super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (TriMesh *)local_88);
                }
                this_00 = local_88;
                iVar4 = (*(local_88->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])
                                  (local_88);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                          *)local_58,(long)iVar4,(allocator_type *)local_78);
                getAllFaceNeighborGMNF
                          (this,(TriMesh *)this_00,(uint)(local_9c == 0) * 2,
                           _normal_iteration_number,local_31[0],
                           (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)local_58);
                iVar4 = (*(this_00->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])
                                  (this_00);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                          *)local_78,(long)iVar4,(allocator_type *)local_110);
                getAllGuidedNeighborGMNF
                          (this,(TriMesh *)this_00,
                           (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)local_78);
                MeshDenoisingBase::getFaceNormal
                          (&this->super_MeshDenoisingBase,(TriMesh *)this_00,local_80);
                iVar4 = (*(this_00->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])
                                  (this_00);
                std::vector<double,_std::allocator<double>_>::vector
                          ((vector<double,_std::allocator<double>_> *)local_110,(long)iVar4,
                           (allocator_type *)
                           &face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
                iVar4 = (*(this_00->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])
                                  (this_00);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)iVar4,
                         (allocator_type *)
                         &face_centroid.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                iVar4 = (*(this_00->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])
                                  (this_00);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&face_centroid.
                             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar4,
                         (allocator_type *)&sigma_r);
                iVar4 = (*(this_00->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])
                                  (this_00);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&sigma_r,(long)iVar4,(allocator_type *)local_178);
                iVar4 = (*(this_00->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])
                                  (this_00);
                all_guided_neighbor.
                super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
                std::
                vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                          *)local_178,(long)iVar4,
                         (allocator_type *)
                         &guided_normals.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                iVar4 = 0;
                while( true ) {
                  centroid = &face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage;
                  if (local_98 <= iVar4) break;
                  this_01 = (GuidedMeshNormalFiltering *)
                            all_guided_neighbor.
                            super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  MeshDenoisingBase::getFaceCentroid
                            ((MeshDenoisingBase *)
                             all_guided_neighbor.
                             super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(TriMesh *)this_00,
                             (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              *)centroid);
                  sigma = getSigmaS(this_01,multiple_radius,
                                    (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     *)centroid,(TriMesh *)this_00);
                  MeshDenoisingBase::getFaceArea
                            ((MeshDenoisingBase *)
                             all_guided_neighbor.
                             super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(TriMesh *)this_00,
                             (vector<double,_std::allocator<double>_> *)local_110);
                  MeshDenoisingBase::getFaceNormal
                            ((MeshDenoisingBase *)
                             all_guided_neighbor.
                             super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(TriMesh *)this_00,
                             (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              *)&face_centroid.
                                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  this_02 = &local_190;
                  std::
                  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                  ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                            *)&local_190,
                           (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                            *)local_178);
                  getGuidedNormals((GuidedMeshNormalFiltering *)this_02,(TriMesh *)this_00,
                                   (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                    *)local_78,(vector<double,_std::allocator<double>_> *)local_110,
                                   (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    *)&face_centroid.
                                       super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                    *)&local_190,
                                   (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    *)&sigma_r);
                  std::
                  _Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                  ::~_Vector_base(&local_190);
                  join_0x00000010_0x00000000_ = OpenMesh::PolyConnectivity::faces_begin(this_00);
                  while( true ) {
                    FVar14 = OpenMesh::PolyConnectivity::faces_end(this_00);
                    if (f_it.mesh_._0_4_ == (BaseHandle)FVar14.hnd_.super_BaseHandle.idx_ &&
                        (mesh_ptr)
                        previous_normals.
                        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage == FVar14.mesh_) break;
                    lVar5 = (long)(int)f_it.mesh_._0_4_;
                    lVar10 = lVar5 * 0x18;
                    this_03 = &guided_normals.
                               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
                              ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                *)this_03,
                               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                *)((long)local_58 + lVar10));
                    f_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
                    f_it.skip_bits_ = 0;
                    lVar7 = 0;
                    while( true ) {
                      this_00 = local_88;
                      if ((int)((ulong)((long)face_neighbor.
                                              super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                              ._M_impl.super__Vector_impl_data._M_start -
                                       (long)guided_normals.
                                             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) >>
                               2) <= lVar7) break;
                      lVar9 = (long)*(int *)((long)((guided_normals.
                                                                                                          
                                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->super_VectorDataT<double,_3>).values_ +
                                            lVar7 * 4);
                      lVar8 = lVar9 * 0x18;
                      _normal_iteration_number =
                           GaussianWeight((GuidedMeshNormalFiltering *)this_03,
                                          SQRT((face_area.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage
                                                [lVar5 * 3 + 2] -
                                               face_area.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage
                                               [lVar9 * 3 + 2]) *
                                               (face_area.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage
                                                [lVar5 * 3 + 2] -
                                               face_area.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage
                                               [lVar9 * 3 + 2]) +
                                               (face_area.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage
                                                [lVar5 * 3] -
                                               face_area.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage
                                               [lVar9 * 3]) *
                                               (face_area.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage
                                                [lVar5 * 3] -
                                               face_area.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage
                                               [lVar9 * 3]) +
                                               (face_area.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage
                                                [lVar5 * 3 + 1] -
                                               face_area.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage
                                               [lVar9 * 3 + 1]) *
                                               (face_area.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage
                                                [lVar5 * 3 + 1] -
                                               face_area.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage
                                               [lVar9 * 3 + 1])),sigma);
                      dVar11 = *(double *)((long)sigma_r + lVar10) -
                               *(double *)((long)sigma_r + lVar8);
                      dVar12 = *(double *)((long)sigma_r + 8 + lVar10) -
                               *(double *)((long)sigma_r + 8 + lVar8);
                      dVar13 = *(double *)((long)sigma_r + 0x10 + lVar10) -
                               *(double *)((long)sigma_r + 0x10 + lVar8);
                      dVar11 = GaussianWeight((GuidedMeshNormalFiltering *)this_03,
                                              SQRT(dVar13 * dVar13 +
                                                   dVar11 * dVar11 + dVar12 * dVar12),
                                              multiple_sigma_s);
                      f_it._8_8_ = face_centroid.
                                   super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar9].
                                   super_VectorDataT<double,_3>.values_[0] *
                                   _normal_iteration_number *
                                   *(double *)((long)local_110 + lVar9 * 8) * dVar11 +
                                   (double)f_it._8_8_;
                      lVar7 = lVar7 + 1;
                    }
                    if ((pointer)face_neighbor.
                                 super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_start !=
                        guided_normals.
                        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      pvVar6 = OpenMesh::VectorT<double,_3>::normalize
                                         ((VectorT<double,_3> *)&f_it.hnd_);
                      pVVar2 = (local_80->
                               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      pVVar2[lVar5].super_VectorDataT<double,_3>.values_[2] =
                           (pvVar6->super_VectorDataT<double,_3>).values_[2];
                      dVar11 = (pvVar6->super_VectorDataT<double,_3>).values_[1];
                      pVVar2 = pVVar2 + lVar5;
                      (pVVar2->super_VectorDataT<double,_3>).values_[0] =
                           (pvVar6->super_VectorDataT<double,_3>).values_[0];
                      (pVVar2->super_VectorDataT<double,_3>).values_[1] = dVar11;
                    }
                    std::_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                    ~_Vector_base((_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                   *)&guided_normals.
                                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    OpenMesh::Iterators::
                    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                  *)&previous_normals.
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
                  }
                  MeshDenoisingBase::updateVertexPosition
                            ((MeshDenoisingBase *)
                             all_guided_neighbor.
                             super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(TriMesh *)this_00,
                             local_80,face_neighbor_index,false);
                  iVar4 = iVar4 + 1;
                }
                std::
                _Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                ::~_Vector_base((_Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                 *)local_178);
                std::
                _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 *)&sigma_r);
                std::
                _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 *)&face_centroid.
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 *)&face_area.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
                std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                          ((_Vector_base<double,_std::allocator<double>_> *)local_110);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                           *)local_78);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                           *)local_58);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::updateFilteredNormalsLocalScheme(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    filtered_normals.resize((int)mesh.n_faces());
    // get parameter for local scheme normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    bool include_central_face;
    if(!parameter_set_->getValue(string("include central face"), include_central_face))
        return;
    double multiple_radius;
    if(!parameter_set_->getValue(string("Multiple(* avg face dis.)"), multiple_radius))
        return;
    double multiple_sigma_s;
    if(!parameter_set_->getValue(string("Multiple(* sigma_s)"), multiple_sigma_s))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("(Local)Normal Iteration Num."), normal_iteration_number))
        return;
    double sigma_r;
    if(!parameter_set_->getValue(string("sigma_r"), sigma_r))
        return;
    int vertex_iteration_number;
    if(!parameter_set_->getValue(string("Vertex Iteration Num."), vertex_iteration_number))
        return;

    FaceNeighborType face_neighbor_type = face_neighbor_index == 0 ? kRadiusBased : kVertexBased;

    double radius;
    if(face_neighbor_type == kRadiusBased)
        radius = getRadius(multiple_radius, mesh);

    std::vector<std::vector<TriMesh::FaceHandle> > all_face_neighbor((int)mesh.n_faces());
    getAllFaceNeighborGMNF(mesh, face_neighbor_type, radius, include_central_face, all_face_neighbor);
    std::vector<std::vector<TriMesh::FaceHandle> > all_guided_neighbor((int)mesh.n_faces());
    getAllGuidedNeighborGMNF(mesh, all_guided_neighbor);
    getFaceNormal(mesh, filtered_normals);

    std::vector<double> face_area((int)mesh.n_faces());
    std::vector<TriMesh::Point> face_centroid((int)mesh.n_faces());
    std::vector<TriMesh::Normal> previous_normals((int)mesh.n_faces());
    std::vector<TriMesh::Normal> guided_normals((int)mesh.n_faces());
    std::vector<std::pair<double, TriMesh::Normal> > range_and_mean_normal((int)mesh.n_faces());
    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        getFaceCentroid(mesh, face_centroid);
        double sigma_s = getSigmaS(multiple_sigma_s, face_centroid, mesh);
        getFaceArea(mesh, face_area);
        getFaceNormal(mesh, previous_normals);

        getGuidedNormals(mesh, all_guided_neighbor, face_area, previous_normals, range_and_mean_normal, guided_normals);

        // Filtered Face Normals
        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            int index = f_it->idx();
            const std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[index];
            TriMesh::Normal filtered_normal(0.0, 0.0, 0.0);
            for(int j = 0; j < (int)face_neighbor.size(); j++)
            {
                int current_face_index = face_neighbor[j].idx();

                double spatial_dis = (face_centroid[index] - face_centroid[current_face_index]).length();
                double spatial_weight = GaussianWeight(spatial_dis, sigma_s);
                double range_dis = (guided_normals[index] - guided_normals[current_face_index]).length();
                double range_weight = GaussianWeight(range_dis, sigma_r);

                filtered_normal += previous_normals[current_face_index] * (face_area[current_face_index] * spatial_weight * range_weight);
            }
            if(face_neighbor.size())
                filtered_normals[index] = filtered_normal.normalize();
        }

        // immediate update vertex position
        updateVertexPosition(mesh, filtered_normals, vertex_iteration_number, false);
    }
}